

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

int process_pass(vw *all,bfgs *b)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  long in_RSI;
  long *in_RDI;
  vw *all_00;
  float fVar4;
  double dVar5;
  float d_mag_2;
  float dd;
  float t_1;
  float d_mag_1;
  curv_exception *anon_var_0;
  double rel_decrease;
  float ratio;
  double new_step;
  double wolfe1;
  float t;
  float d_mag;
  float temp_1;
  float temp;
  int status;
  size_t in_stack_00000110;
  string *in_stack_00000118;
  vw *in_stack_00000120;
  vw *in_stack_ffffffffffffff48;
  vw *in_stack_ffffffffffffff50;
  vw *in_stack_ffffffffffffff58;
  double *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  float fVar6;
  vw *in_stack_ffffffffffffff70;
  bfgs *in_stack_ffffffffffffff78;
  vw *in_stack_ffffffffffffff80;
  vw *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  double in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  int local_14;
  
  local_14 = 0;
  finalize_preconditioner(in_stack_ffffffffffffff50,(bfgs *)in_stack_ffffffffffffff48,0.0);
  if ((*(byte *)(in_RSI + 0x110) & 1) == 0) {
    fVar4 = (float)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    if ((*(byte *)(in_RSI + 0x111) & 1) == 0) {
      if (in_RDI[4] != 0) {
        fVar4 = accumulate_scalar(in_stack_ffffffffffffff50,fVar4);
        *(double *)(in_RSI + 0x108) = (double)fVar4;
      }
      if (0.0 < *(float *)((long)in_RDI + 0x32c)) {
        dVar5 = regularizer_direction_magnitude
                          (in_stack_ffffffffffffff58,(bfgs *)in_stack_ffffffffffffff50,
                           (float)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        *(double *)(in_RSI + 0x108) = dVar5 + *(double *)(in_RSI + 0x108);
      }
      dVar5 = derivative_in_direction
                        (in_stack_ffffffffffffff58,(bfgs *)in_stack_ffffffffffffff50,
                         (float *)in_stack_ffffffffffffff48,(int *)0x2d454c);
      fVar4 = (float)dVar5;
      if (((*(double *)(in_RSI + 0x108) != 0.0) || (NAN(*(double *)(in_RSI + 0x108)))) ||
         ((fVar4 == 0.0 && (!NAN(fVar4))))) {
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          *(float *)(in_RSI + 0xf8) = -fVar4 / (float)*(double *)(in_RSI + 0x108);
        }
        else {
          fprintf(_stdout,"Derivative 0 detected.\n");
          *(undefined4 *)(in_RSI + 0xf8) = 0;
          local_14 = 2;
        }
      }
      else {
        fprintf(_stdout,"%s",curv_message);
        *(undefined4 *)(in_RSI + 0xf8) = 0;
        local_14 = 1;
      }
      fVar4 = direction_magnitude(in_stack_ffffffffffffff48);
      fVar6 = (float)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      v_array<float>::clear((v_array<float> *)in_stack_ffffffffffffff50);
      update_weight(in_stack_ffffffffffffff50,fVar6);
      ftime(in_RSI + 0x58);
      *(double *)(in_RSI + 0x68) =
           (double)(int)((double)(*(long *)(in_RSI + 0x58) - *(long *)(in_RSI + 0x48)) * 1000.0 +
                        (double)(int)((uint)*(ushort *)(in_RSI + 0x60) -
                                     (uint)*(ushort *)(in_RSI + 0x50)));
      if ((*(byte *)((long)in_RDI + 0x3439) & 1) == 0) {
        fprintf(_stderr,"%-10.5f\t%-10.5f\t%-.5f\n",
                *(double *)(in_RSI + 0x108) / *(double *)(in_RSI + 0x100),(double)fVar4,
                (double)*(float *)(in_RSI + 0xf8));
      }
      *(undefined1 *)(in_RSI + 0x111) = 1;
    }
    else {
      if (in_RDI[4] != 0) {
        in_stack_ffffffffffffffdc = (float)*(double *)(in_RSI + 0xe8);
        fVar4 = accumulate_scalar(in_stack_ffffffffffffff50,fVar4);
        *(double *)(in_RSI + 0xe8) = (double)fVar4;
        accumulate((vw *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (parameters *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   (size_t)in_stack_ffffffffffffffd0);
      }
      if (0.0 < *(float *)((long)in_RDI + 0x32c)) {
        dVar5 = add_regularization(in_stack_ffffffffffffff58,(bfgs *)in_stack_ffffffffffffff50,
                                   (float)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        *(double *)(in_RSI + 0xe8) = dVar5 + *(double *)(in_RSI + 0xe8);
      }
      if ((*(byte *)((long)in_RDI + 0x3439) & 1) == 0) {
        if (((*(byte *)((long)in_RDI + 0x3457) & 1) == 0) && (*(long *)(in_RSI + 0x98) != 0)) {
          if ((((*(double *)(*in_RDI + 0xa8) != 0.0) || (NAN(*(double *)(*in_RDI + 0xa8)))) ||
              (*(double *)(*in_RDI + 0xa0) != 0.0)) || (NAN(*(double *)(*in_RDI + 0xa0)))) {
            fprintf(_stderr,"%2lu h%-10.5f\t",
                    *(double *)(*in_RDI + 0xa8) / *(double *)(*in_RDI + 0xa0),
                    *(long *)(in_RSI + 0x98) + 1);
          }
          else {
            fprintf(_stderr,"%2lu ",*(long *)(in_RSI + 0x98) + 1);
            fprintf(_stderr,"h unknown    ");
          }
        }
        else {
          fprintf(_stderr,"%2lu %-10.5f\t",*(double *)(in_RSI + 0xe8) / *(double *)(in_RSI + 0x100),
                  *(long *)(in_RSI + 0x98) + 1);
        }
      }
      dVar5 = wolfe_eval(in_stack_ffffffffffffff88,(bfgs *)in_stack_ffffffffffffff80,
                         (float *)in_stack_ffffffffffffff78,(double)in_stack_ffffffffffffff70,
                         (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (double)in_stack_ffffffffffffff60,(double)in_stack_ffffffffffffff58,
                         (int *)in_stack_ffffffffffffff50,(double *)in_stack_ffffffffffffff48);
      fVar4 = (float)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      bVar3 = nanpattern(0.0);
      if (bVar3) {
        fprintf(_stderr,"\n");
        fprintf(_stdout,"Derivative 0 detected.\n");
        *(undefined4 *)(in_RSI + 0xf8) = 0;
        local_14 = 2;
      }
      else if (((*(byte *)(in_RSI + 0xb1) & 1) == 0) ||
              ((*(double *)(in_RSI + 0x10) <= in_stack_ffffffffffffffd0 &&
               (*(double *)(in_RSI + 0xe8) < *(double *)(in_RSI + 0xf0) ||
                *(double *)(in_RSI + 0xe8) == *(double *)(in_RSI + 0xf0))))) {
        dVar5 = *(double *)(in_RSI + 0xf0);
        dVar1 = *(double *)(in_RSI + 0xe8);
        dVar2 = *(double *)(in_RSI + 0xf0);
        bVar3 = nanpattern(0.0);
        if ((!bVar3) &&
           (((*(byte *)(in_RSI + 0xb1) & 1) != 0 &&
            (ABS((dVar5 - dVar1) / dVar2) < (double)*(float *)(in_RSI + 0xc))))) {
          fprintf(_stdout,
                  "\nTermination condition reached in pass %ld: decrease in loss less than %.3f%%.\nIf you want to optimize further, decrease termination threshold.\n"
                  ,(double)*(float *)(in_RSI + 0xc) * 100.0,*(long *)(in_RSI + 0x98) + 1);
          local_14 = 2;
        }
        *(undefined8 *)(in_RSI + 0xf0) = *(undefined8 *)(in_RSI + 0xe8);
        *(undefined8 *)(in_RSI + 0xe8) = 0;
        *(undefined8 *)(in_RSI + 0x90) = 0;
        *(undefined8 *)(in_RSI + 0x108) = 0;
        *(undefined4 *)(in_RSI + 0xf8) = 0x3f800000;
        all_00 = (vw *)(in_RSI + 0xe4);
        bfgs_iter_middle(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                         (float *)in_stack_ffffffffffffff70,
                         (double *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58,
                         (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        if ((*(byte *)((long)in_RDI + 0x9d) & 1) == 0) {
          fVar4 = direction_magnitude(all_00);
          fVar6 = (float)((ulong)all_00 >> 0x20);
          ftime(in_RSI + 0x58);
          *(double *)(in_RSI + 0x68) =
               (double)(int)((double)(*(long *)(in_RSI + 0x58) - *(long *)(in_RSI + 0x48)) * 1000.0
                            + (double)(int)((uint)*(ushort *)(in_RSI + 0x60) -
                                           (uint)*(ushort *)(in_RSI + 0x50)));
          if ((*(byte *)((long)in_RDI + 0x3439) & 1) == 0) {
            fprintf(_stderr,"%-10s\t%-10.5f\t%-.5f\n",(double)fVar4,
                    (double)*(float *)(in_RSI + 0xf8),"");
          }
          v_array<float>::clear((v_array<float> *)in_stack_ffffffffffffff50);
          update_weight(in_stack_ffffffffffffff50,fVar6);
        }
        else {
          *(undefined1 *)(in_RSI + 0x111) = 0;
        }
      }
      else {
        ftime(in_RSI + 0x58);
        *(double *)(in_RSI + 0x68) =
             (double)(int)((double)(*(long *)(in_RSI + 0x58) - *(long *)(in_RSI + 0x48)) * 1000.0 +
                          (double)(int)((uint)*(ushort *)(in_RSI + 0x60) -
                                       (uint)*(ushort *)(in_RSI + 0x50)));
        if ((*(float *)(in_RSI + 0xf8) != 0.0) || (NAN(*(float *)(in_RSI + 0xf8)))) {
          fVar6 = (float)dVar5 / *(float *)(in_RSI + 0xf8);
        }
        else {
          fVar6 = 0.0;
        }
        if ((*(byte *)((long)in_RDI + 0x3439) & 1) == 0) {
          fprintf(_stderr,"%-10s\t%-10s\t(revise x %.1f)\t%-.5f\n",(double)fVar6,dVar5,"");
        }
        v_array<float>::clear((v_array<float> *)in_stack_ffffffffffffff50);
        update_weight(in_stack_ffffffffffffff50,fVar4);
        *(float *)(in_RSI + 0xf8) = (float)dVar5;
        zero_derivative((vw *)0x2d4135);
        *(undefined8 *)(in_RSI + 0xe8) = 0;
      }
    }
  }
  else {
    if (in_RDI[4] != 0) {
      accumulate((vw *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (parameters *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (size_t)in_stack_ffffffffffffffd0);
      fVar4 = accumulate_scalar(in_stack_ffffffffffffff50,
                                (float)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      *(double *)(in_RSI + 0x100) = (double)fVar4;
    }
    if (in_RDI[4] != 0) {
      in_stack_ffffffffffffffe4 = (float)*(double *)(in_RSI + 0xe8);
      fVar4 = accumulate_scalar(in_stack_ffffffffffffff50,
                                (float)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      *(double *)(in_RSI + 0xe8) = (double)fVar4;
      accumulate((vw *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (parameters *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (size_t)in_stack_ffffffffffffffd0);
    }
    if (0.0 < *(float *)((long)in_RDI + 0x32c)) {
      dVar5 = add_regularization(in_stack_ffffffffffffff58,(bfgs *)in_stack_ffffffffffffff50,
                                 (float)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      *(double *)(in_RSI + 0xe8) = dVar5 + *(double *)(in_RSI + 0xe8);
    }
    if ((*(byte *)((long)in_RDI + 0x3439) & 1) == 0) {
      fprintf(_stderr,"%2lu %-10.5f\t",*(double *)(in_RSI + 0xe8) / *(double *)(in_RSI + 0x100),
              *(long *)(in_RSI + 0x98) + 1);
    }
    *(undefined8 *)(in_RSI + 0xf0) = *(undefined8 *)(in_RSI + 0xe8);
    *(undefined8 *)(in_RSI + 0xe8) = 0;
    *(undefined8 *)(in_RSI + 0x90) = 0;
    *(undefined8 *)(in_RSI + 0x108) = 0;
    bfgs_iter_start(in_stack_ffffffffffffff70,
                    (bfgs *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                    (float *)in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58,
                    (double)in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48);
    if ((*(byte *)(in_RSI + 0xb0) & 1) == 0) {
      *(undefined4 *)(in_RSI + 0xf8) = 0x3f000000;
      in_stack_ffffffffffffffe0 = direction_magnitude(in_stack_ffffffffffffff48);
      fVar4 = (float)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      ftime(in_RSI + 0x58);
      *(double *)(in_RSI + 0x68) =
           (double)(int)((double)(*(long *)(in_RSI + 0x58) - *(long *)(in_RSI + 0x48)) * 1000.0 +
                        (double)(int)((uint)*(ushort *)(in_RSI + 0x60) -
                                     (uint)*(ushort *)(in_RSI + 0x50)));
      if ((*(byte *)((long)in_RDI + 0x3439) & 1) == 0) {
        fprintf(_stderr,"%-10s\t%-10.5f\t%-.5f\n",(double)in_stack_ffffffffffffffe0,
                (double)*(float *)(in_RSI + 0xf8),"");
      }
      v_array<float>::clear((v_array<float> *)in_stack_ffffffffffffff50);
      update_weight(in_stack_ffffffffffffff50,fVar4);
    }
    else {
      *(undefined1 *)(in_RSI + 0x111) = 0;
    }
  }
  *(long *)(in_RSI + 0x98) = *(long *)(in_RSI + 0x98) + 1;
  *(undefined1 *)(in_RSI + 0x110) = 0;
  *(undefined1 *)(in_RSI + 0x112) = 0;
  if (((*(byte *)(in_RSI + 0xb8) & 1) != 0) && (in_RDI[4] != 0)) {
    accumulate((vw *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (parameters *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (size_t)in_stack_ffffffffffffffd0);
  }
  ftime(in_RSI + 0x58);
  *(double *)(in_RSI + 0x68) =
       (double)(int)((double)(*(long *)(in_RSI + 0x58) - *(long *)(in_RSI + 0x48)) * 1000.0 +
                    (double)(int)((uint)*(ushort *)(in_RSI + 0x60) -
                                 (uint)*(ushort *)(in_RSI + 0x50)));
  if ((*(byte *)(in_RDI + 0x12) & 1) != 0) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffff70,(string *)(in_RDI + 0x6ae));
    save_predictor(in_stack_00000120,in_stack_00000118,in_stack_00000110);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  }
  return local_14;
}

Assistant:

int process_pass(vw& all, bfgs& b)
{
  int status = LEARN_OK;

  finalize_preconditioner(all, b, all.l2_lambda);
  /********************************************************************/
  /* A) FIRST PASS FINISHED: INITIALIZE FIRST LINE SEARCH *************/
  /********************************************************************/
  if (b.first_pass)
  {
    if (all.all_reduce != nullptr)
    {
      accumulate(all, all.weights, W_COND);  // Accumulate preconditioner
      float temp = (float)b.importance_weight_sum;
      b.importance_weight_sum = accumulate_scalar(all, temp);
    }
    // finalize_preconditioner(all, b, all.l2_lambda);
    if (all.all_reduce != nullptr)
    {
      float temp = (float)b.loss_sum;
      b.loss_sum = accumulate_scalar(all, temp);  // Accumulate loss_sums
      accumulate(all, all.weights, 1);            // Accumulate gradients from all nodes
    }
    if (all.l2_lambda > 0.)
      b.loss_sum += add_regularization(all, b, all.l2_lambda);
    if (!all.quiet)
      fprintf(stderr, "%2lu %-10.5f\t", (long unsigned int)b.current_pass + 1, b.loss_sum / b.importance_weight_sum);

    b.previous_loss_sum = b.loss_sum;
    b.loss_sum = 0.;
    b.example_number = 0;
    b.curvature = 0;
    bfgs_iter_start(all, b, b.mem, b.lastj, b.importance_weight_sum, b.origin);
    if (b.first_hessian_on)
    {
      b.gradient_pass = false;  // now start computing curvature
    }
    else
    {
      b.step_size = 0.5;
      float d_mag = direction_magnitude(all);
      ftime(&b.t_end_global);
      b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
          (b.t_end_global.millitm - b.t_start_global.millitm));
      if (!all.quiet)
        fprintf(stderr, "%-10s\t%-10.5f\t%-.5f\n", "", d_mag, b.step_size);
      b.predictions.clear();
      update_weight(all, b.step_size);
    }
  }
  else
      /********************************************************************/
      /* B) GRADIENT CALCULATED *******************************************/
      /********************************************************************/
      if (b.gradient_pass)  // We just finished computing all gradients
  {
    if (all.all_reduce != nullptr)
    {
      float t = (float)b.loss_sum;
      b.loss_sum = accumulate_scalar(all, t);  // Accumulate loss_sums
      accumulate(all, all.weights, 1);         // Accumulate gradients from all nodes
    }
    if (all.l2_lambda > 0.)
      b.loss_sum += add_regularization(all, b, all.l2_lambda);
    if (!all.quiet)
    {
      if (!all.holdout_set_off && b.current_pass >= 1)
      {
        if (all.sd->holdout_sum_loss_since_last_pass == 0. && all.sd->weighted_holdout_examples_since_last_pass == 0.)
        {
          fprintf(stderr, "%2lu ", (long unsigned int)b.current_pass + 1);
          fprintf(stderr, "h unknown    ");
        }
        else
          fprintf(stderr, "%2lu h%-10.5f\t", (long unsigned int)b.current_pass + 1,
              all.sd->holdout_sum_loss_since_last_pass / all.sd->weighted_holdout_examples_since_last_pass);
      }
      else
        fprintf(stderr, "%2lu %-10.5f\t", (long unsigned int)b.current_pass + 1, b.loss_sum / b.importance_weight_sum);
    }
    double wolfe1;
    double new_step = wolfe_eval(
        all, b, b.mem, b.loss_sum, b.previous_loss_sum, b.step_size, b.importance_weight_sum, b.origin, wolfe1);

    /********************************************************************/
    /* B0) DERIVATIVE ZERO: MINIMUM FOUND *******************************/
    /********************************************************************/
    if (nanpattern((float)wolfe1))
    {
      fprintf(stderr, "\n");
      fprintf(stdout, "Derivative 0 detected.\n");
      b.step_size = 0.0;
      status = LEARN_CONV;
    }
    /********************************************************************/
    /* B1) LINE SEARCH FAILED *******************************************/
    /********************************************************************/
    else if (b.backstep_on && (wolfe1 < b.wolfe1_bound || b.loss_sum > b.previous_loss_sum))
    {
      // curvature violated, or we stepped too far last time: step back
      ftime(&b.t_end_global);
      b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
          (b.t_end_global.millitm - b.t_start_global.millitm));
      float ratio = (b.step_size == 0.f) ? 0.f : (float)new_step / (float)b.step_size;
      if (!all.quiet)
        fprintf(stderr, "%-10s\t%-10s\t(revise x %.1f)\t%-.5f\n", "", "", ratio, new_step);
      b.predictions.clear();
      update_weight(all, (float)(-b.step_size + new_step));
      b.step_size = (float)new_step;
      zero_derivative(all);
      b.loss_sum = 0.;
    }

    /********************************************************************/
    /* B2) LINE SEARCH SUCCESSFUL OR DISABLED          ******************/
    /*     DETERMINE NEXT SEARCH DIRECTION             ******************/
    /********************************************************************/
    else
    {
      double rel_decrease = (b.previous_loss_sum - b.loss_sum) / b.previous_loss_sum;
      if (!nanpattern((float)rel_decrease) && b.backstep_on && fabs(rel_decrease) < b.rel_threshold)
      {
        fprintf(stdout,
            "\nTermination condition reached in pass %ld: decrease in loss less than %.3f%%.\n"
            "If you want to optimize further, decrease termination threshold.\n",
            (long int)b.current_pass + 1, b.rel_threshold * 100.0);
        status = LEARN_CONV;
      }
      b.previous_loss_sum = b.loss_sum;
      b.loss_sum = 0.;
      b.example_number = 0;
      b.curvature = 0;
      b.step_size = 1.0;

      try
      {
        bfgs_iter_middle(all, b, b.mem, b.rho, b.alpha, b.lastj, b.origin);
      }
      catch (const curv_exception&)
      {
        fprintf(stdout, "In bfgs_iter_middle: %s", curv_message);
        b.step_size = 0.0;
        status = LEARN_CURV;
      }

      if (all.hessian_on)
      {
        b.gradient_pass = false;  // now start computing curvature
      }
      else
      {
        float d_mag = direction_magnitude(all);
        ftime(&b.t_end_global);
        b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
            (b.t_end_global.millitm - b.t_start_global.millitm));
        if (!all.quiet)
          fprintf(stderr, "%-10s\t%-10.5f\t%-.5f\n", "", d_mag, b.step_size);
        b.predictions.clear();
        update_weight(all, b.step_size);
      }
    }
  }

  /********************************************************************/
  /* C) NOT FIRST PASS, CURVATURE CALCULATED **************************/
  /********************************************************************/
  else  // just finished all second gradients
  {
    if (all.all_reduce != nullptr)
    {
      float t = (float)b.curvature;
      b.curvature = accumulate_scalar(all, t);  // Accumulate curvatures
    }
    if (all.l2_lambda > 0.)
      b.curvature += regularizer_direction_magnitude(all, b, all.l2_lambda);
    float dd = (float)derivative_in_direction(all, b, b.mem, b.origin);
    if (b.curvature == 0. && dd != 0.)
    {
      fprintf(stdout, "%s", curv_message);
      b.step_size = 0.0;
      status = LEARN_CURV;
    }
    else if (dd == 0.)
    {
      fprintf(stdout, "Derivative 0 detected.\n");
      b.step_size = 0.0;
      status = LEARN_CONV;
    }
    else
      b.step_size = -dd / (float)b.curvature;

    float d_mag = direction_magnitude(all);

    b.predictions.clear();
    update_weight(all, b.step_size);
    ftime(&b.t_end_global);
    b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
        (b.t_end_global.millitm - b.t_start_global.millitm));

    if (!all.quiet)
      fprintf(stderr, "%-10.5f\t%-10.5f\t%-.5f\n", b.curvature / b.importance_weight_sum, d_mag, b.step_size);
    b.gradient_pass = true;
  }  // now start computing derivatives.
  b.current_pass++;
  b.first_pass = false;
  b.preconditioner_pass = false;

  if (b.output_regularizer)  // need to accumulate and place the regularizer.
  {
    if (all.all_reduce != nullptr)
      accumulate(all, all.weights, W_COND);  // Accumulate preconditioner
    // preconditioner_to_regularizer(all, b, all.l2_lambda);
  }
  ftime(&b.t_end_global);
  b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
      (b.t_end_global.millitm - b.t_start_global.millitm));

  if (all.save_per_pass)
    save_predictor(all, all.final_regressor_name, b.current_pass);
  return status;
}